

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

void __thiscall
HighsDomain::conflictAnalyzeReconvergence
          (HighsDomain *this,HighsDomainChange *domchg,HighsInt *proofinds,double *proofvals,
          HighsInt prooflen,double proofrhs,HighsConflictPool *conflictPool)

{
  HighsDomain *this_00;
  pointer ppVar1;
  double dVar2;
  int iVar3;
  HighsMipSolverData *pHVar4;
  pointer piVar5;
  bool bVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint depthLevel;
  ulong uVar10;
  HighsInt ninfmin;
  double local_118;
  HighsCDouble activitymin;
  ConflictSet conflictSet;
  LocalDomChg local_48;
  
  pHVar4 = (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  this_00 = &pHVar4->domain;
  if (((this_00 != this) && ((pHVar4->domain).infeasible_ == false)) &&
     (local_118 = proofrhs, propagate(this_00),
     (((this->mipsolver->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->domain).infeasible_ ==
     false)) {
    ConflictSet::ConflictSet(&conflictSet,this);
    computeMinActivity(&((this->mipsolver->mipdata_)._M_t.
                         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                         .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->domain,0
                       ,prooflen,proofinds,proofvals,&ninfmin,&activitymin);
    if (ninfmin == 0) {
      local_48.pos = (HighsInt)
                     ((ulong)((long)(this->domchgstack_).
                                    super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->domchgstack_).
                                   super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4);
      local_48.domchg.boundval = domchg->boundval;
      local_48.domchg.column = domchg->column;
      local_48.domchg.boundtype = domchg->boundtype;
      bVar6 = ConflictSet::explainBoundChangeLeq
                        (&conflictSet,&conflictSet.reconvergenceFrontier,&local_48,proofinds,
                         proofvals,prooflen,local_118,activitymin.hi + activitymin.lo);
      if ((bVar6) &&
         (pHVar4 = (this->mipsolver->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl,
         uVar7 = (((long)conflictSet.resolvedDomainChanges.
                         super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)conflictSet.resolvedDomainChanges.
                        super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18) * 10,
         uVar10 = ((long)*(pointer *)
                          ((long)&(pHVar4->integral_cols).
                                  super__Vector_base<int,_std::allocator<int>_> + 8) -
                   *(long *)&(pHVar4->integral_cols).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl >> 2) * 3 + 1000, uVar7 < uVar10 || uVar7 - uVar10 == 0)) {
        std::
        _Rb_tree<HighsDomain::ConflictSet::LocalDomChg,HighsDomain::ConflictSet::LocalDomChg,std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,std::less<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>
        ::
        _M_insert_range_unique<__gnu_cxx::__normal_iterator<HighsDomain::ConflictSet::LocalDomChg*,std::vector<HighsDomain::ConflictSet::LocalDomChg,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>>>
                  ((_Rb_tree<HighsDomain::ConflictSet::LocalDomChg,HighsDomain::ConflictSet::LocalDomChg,std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,std::less<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>
                    *)&conflictSet.reconvergenceFrontier,
                   (__normal_iterator<HighsDomain::ConflictSet::LocalDomChg_*,_std::vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>_>
                    )conflictSet.resolvedDomainChanges.
                     super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<HighsDomain::ConflictSet::LocalDomChg_*,_std::vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>_>
                    )conflictSet.resolvedDomainChanges.
                     super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        piVar5 = (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = (ulong)((long)(this->branchPos_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)piVar5) >> 2;
        uVar8 = (uint)uVar7;
        uVar7 = uVar7 & 0xffffffff;
        uVar9 = uVar8 + 1;
        while (depthLevel = (int)uVar8 >> 0x1f & uVar8, 0 < (int)uVar7) {
          iVar3 = piVar5[uVar7 - 1];
          uVar7 = uVar7 - 1;
          dVar2 = (this->domchgstack_).
                  super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar3].boundval;
          uVar9 = uVar9 - 1;
          ppVar1 = (this->prevboundval_).
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + iVar3;
          depthLevel = uVar9;
          if ((dVar2 != ppVar1->first) || (NAN(dVar2) || NAN(ppVar1->first))) break;
        }
        ConflictSet::resolveDepth
                  (&conflictSet,&conflictSet.reconvergenceFrontier,depthLevel,0,0,false);
        HighsConflictPool::addReconvergenceCut
                  (conflictPool,this,&conflictSet.reconvergenceFrontier,domchg);
      }
    }
    ConflictSet::~ConflictSet(&conflictSet);
  }
  return;
}

Assistant:

void HighsDomain::conflictAnalyzeReconvergence(
    const HighsDomainChange& domchg, const HighsInt* proofinds,
    const double* proofvals, HighsInt prooflen, double proofrhs,
    HighsConflictPool& conflictPool) {
  if (&mipsolver->mipdata_->domain == this) return;

  if (mipsolver->mipdata_->domain.infeasible()) return;

  mipsolver->mipdata_->domain.propagate();
  if (mipsolver->mipdata_->domain.infeasible()) return;

  ConflictSet conflictSet(*this);

  HighsInt ninfmin;
  HighsCDouble activitymin;
  mipsolver->mipdata_->domain.computeMinActivity(
      0, prooflen, proofinds, proofvals, ninfmin, activitymin);
  if (ninfmin != 0) return;

  if (!conflictSet.explainBoundChangeLeq(
          conflictSet.reconvergenceFrontier,
          ConflictSet::LocalDomChg{HighsInt(domchgstack_.size()), domchg},
          proofinds, proofvals, prooflen, proofrhs, double(activitymin)))
    return;

  if (10 * conflictSet.resolvedDomainChanges.size() >
      1000 + 3 * mipsolver->mipdata_->integral_cols.size())
    return;

  conflictSet.reconvergenceFrontier.insert(
      conflictSet.resolvedDomainChanges.begin(),
      conflictSet.resolvedDomainChanges.end());

  HighsInt depth = branchPos_.size();

  while (depth > 0) {
    HighsInt branchPos = branchPos_[depth - 1];
    if (domchgstack_[branchPos].boundval != prevboundval_[branchPos].first)
      break;

    --depth;
  }

  conflictSet.resolveDepth(conflictSet.reconvergenceFrontier, depth, 0);
  conflictPool.addReconvergenceCut(*this, conflictSet.reconvergenceFrontier,
                                   domchg);
}